

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsBase.cpp
# Opt level: O3

string * vkt::sparse::getOpTypeImageSparse
                   (string *__return_storage_ptr__,ImageType imageType,TextureFormat *format,
                   string *componentType,bool requiresSampler)

{
  uint uVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  ostringstream src;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,"OpTypeImage ",0xc);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)aoStack_1a8,(componentType->_M_dataplus)._M_p,
                      componentType->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if (imageType < IMAGE_TYPE_BUFFER) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_1a8,&DAT_00b44884 + *(int *)(&DAT_00b44884 + (ulong)imageType * 4)
               ,*(long *)(&DAT_00b448a0 + (ulong)imageType * 8));
  }
  pcVar4 = "2 ";
  if (requiresSampler) {
    pcVar4 = "1 ";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,pcVar4,2);
  uVar3 = (ulong)format->order;
  if ((uVar3 < 9) && ((0x1a1U >> (format->order & (sBGR|sRGBA)) & 1) != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_1a8,&DAT_00b448d8 + *(int *)(&DAT_00b448d8 + uVar3 * 4),
               *(long *)(&DAT_00b44900 + uVar3 * 8));
  }
  uVar1 = format->type - SIGNED_INT8;
  if ((uVar1 < 7) && ((0x5fU >> (uVar1 & 0x1f) & 1) != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_1a8,&DAT_00b44948 + *(int *)(&DAT_00b44948 + (ulong)uVar1 * 4),
               *(long *)(&DAT_00b44968 + (ulong)uVar1 * 8));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string getOpTypeImageSparse (const ImageType			imageType,
								  const tcu::TextureFormat&	format,
								  const std::string&		componentType,
								  const bool				requiresSampler)
{
	std::ostringstream	src;

	src << "OpTypeImage " << componentType << " ";

	switch (imageType)
	{
		case IMAGE_TYPE_1D :
			src << "1D 0 0 0 ";
		break;
		case IMAGE_TYPE_1D_ARRAY :
			src << "1D 0 1 0 ";
		break;
		case IMAGE_TYPE_2D :
			src << "2D 0 0 0 ";
		break;
		case IMAGE_TYPE_2D_ARRAY :
			src << "2D 0 1 0 ";
		break;
		case IMAGE_TYPE_3D :
			src << "3D 0 0 0 ";
		break;
		case IMAGE_TYPE_CUBE :
			src << "Cube 0 0 0 ";
		break;
		case IMAGE_TYPE_CUBE_ARRAY :
			src << "Cube 0 1 0 ";
		break;
		default :
			DE_ASSERT(0);
		break;
	};

	if (requiresSampler)
		src << "1 ";
	else
		src << "2 ";

	switch (format.order)
	{
		case tcu::TextureFormat::R:
			src << "R";
		break;
		case tcu::TextureFormat::RG:
			src << "Rg";
			break;
		case tcu::TextureFormat::RGB:
			src << "Rgb";
			break;
		case tcu::TextureFormat::RGBA:
			src << "Rgba";
		break;
		default:
			DE_ASSERT(0);
		break;
	}

	switch (format.type)
	{
		case tcu::TextureFormat::SIGNED_INT8:
			src << "8i";
		break;
		case tcu::TextureFormat::SIGNED_INT16:
			src << "16i";
		break;
		case tcu::TextureFormat::SIGNED_INT32:
			src << "32i";
		break;
		case tcu::TextureFormat::UNSIGNED_INT8:
			src << "8ui";
		break;
		case tcu::TextureFormat::UNSIGNED_INT16:
			src << "16ui";
		break;
		case tcu::TextureFormat::UNSIGNED_INT32:
			src << "32ui";
		break;
		default:
			DE_ASSERT(0);
		break;
	};

	return src.str();
}